

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O0

void binbuf_addv(_binbuf *x,char *fmt,...)

{
  char cVar1;
  char in_AL;
  undefined8 in_RCX;
  char *pcVar2;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_798;
  double *local_780;
  int *local_760;
  double local_748 [4];
  undefined8 local_728;
  undefined8 local_720;
  undefined8 local_718;
  undefined8 local_708;
  undefined8 local_6f8;
  undefined8 local_6e8;
  undefined8 local_6d8;
  undefined8 local_6c8;
  undefined8 local_6b8;
  undefined8 local_6a8;
  char *local_690;
  char *fp;
  t_atom **pptStack_680;
  int nargs;
  t_atom *at;
  t_atom arg [100];
  va_list ap;
  char *fmt_local;
  _binbuf *x_local;
  
  if (in_AL != '\0') {
    local_718 = in_XMM0_Qa;
    local_708 = in_XMM1_Qa;
    local_6f8 = in_XMM2_Qa;
    local_6e8 = in_XMM3_Qa;
    local_6d8 = in_XMM4_Qa;
    local_6c8 = in_XMM5_Qa;
    local_6b8 = in_XMM6_Qa;
    local_6a8 = in_XMM7_Qa;
  }
  pptStack_680 = &at;
  ap[0]._0_8_ = &stack0x00000008;
  arg[99].a_w._4_4_ = 0x30;
  arg[99].a_w.w_float = 2.24208e-44;
  local_690 = fmt;
  for (fp._4_4_ = 0; local_748[2] = (double)in_RDX, local_748[3] = (double)in_RCX, local_728 = in_R8
      , local_720 = in_R9, fp._4_4_ < 100; fp._4_4_ = fp._4_4_ + 1) {
    pcVar2 = local_690 + 1;
    cVar1 = *local_690;
    local_690 = pcVar2;
    if (cVar1 == ',') {
      *(undefined4 *)pptStack_680 = 5;
      *(undefined4 *)(pptStack_680 + 1) = 0;
    }
    else if (cVar1 == ';') {
      *(undefined4 *)pptStack_680 = 4;
      *(undefined4 *)(pptStack_680 + 1) = 0;
    }
    else if (cVar1 == 'f') {
      *(undefined4 *)pptStack_680 = 1;
      if ((uint)arg[99].a_w._4_4_ < 0xa1) {
        local_780 = (double *)((long)local_748 + (long)(int)arg[99].a_w._4_4_);
        arg[99].a_w._4_4_ = arg[99].a_w._4_4_ + 0x10;
      }
      else {
        local_780 = (double *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      *(float *)(pptStack_680 + 1) = (float)*local_780;
    }
    else if (cVar1 == 'i') {
      *(undefined4 *)pptStack_680 = 1;
      if ((uint)arg[99].a_w._0_4_ < 0x29) {
        local_760 = (int *)((long)local_748 + (long)(int)arg[99].a_w._0_4_);
        arg[99].a_w._0_4_ = arg[99].a_w.w_index + 8;
      }
      else {
        local_760 = (int *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      *(float *)(pptStack_680 + 1) = (float)*local_760;
    }
    else {
      if (cVar1 != 's') goto LAB_001985fc;
      *(undefined4 *)pptStack_680 = 2;
      if ((uint)arg[99].a_w._0_4_ < 0x29) {
        local_798 = (undefined8 *)((long)local_748 + (long)(int)arg[99].a_w._0_4_);
        arg[99].a_w._0_4_ = arg[99].a_w.w_index + 8;
      }
      else {
        local_798 = (undefined8 *)ap[0]._0_8_;
        ap[0]._0_8_ = ap[0]._0_8_ + 8;
      }
      pptStack_680[1] = (t_atom *)*local_798;
    }
    pptStack_680 = pptStack_680 + 2;
  }
  pd_error((void *)0x0,"binbuf_addmessv: only %d allowed",100);
LAB_001985fc:
  binbuf_add(x,fp._4_4_,(t_atom *)&at);
  return;
}

Assistant:

void binbuf_addv(t_binbuf *x, const char *fmt, ...)
{
    va_list ap;
    t_atom arg[MAXADDMESSV], *at =arg;
    int nargs = 0;
    const char *fp = fmt;

    va_start(ap, fmt);
    while (1)
    {
        if (nargs >= MAXADDMESSV)
        {
            pd_error(0, "binbuf_addmessv: only %d allowed", MAXADDMESSV);
            break;
        }
        switch(*fp++)
        {
        case 'i': SETFLOAT(at, va_arg(ap, int)); break;
        case 'f': SETFLOAT(at, va_arg(ap, double)); break;
        case 's': SETSYMBOL(at, va_arg(ap, t_symbol *)); break;
        case ';': SETSEMI(at); break;
        case ',': SETCOMMA(at); break;
        default: goto done;
        }
        at++;
        nargs++;
    }
done:
    va_end(ap);
    binbuf_add(x, nargs, arg);
}